

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,char_const(&)[4],char_const(&)[4]>
          (pybind11 *this,char (*args_) [4],char (*args__1) [4])

{
  PyTypeObject *pPVar1;
  bool bVar2;
  int iVar3;
  cast_error *this_00;
  PyObject **ppPVar4;
  handle local_120;
  iterator local_118;
  value_type *arg_value_1;
  iterator __end0_1;
  iterator __begin0_1;
  array<pybind11::object,_2UL> *__range2_1;
  int counter;
  char local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  iterator local_90;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_2UL> *__range2;
  PyObject *local_68;
  handle local_50;
  PyObject *local_48;
  pybind11 *local_40;
  undefined1 local_38 [8];
  array<pybind11::object,_2UL> args;
  size_t size;
  char (*args__local_1) [4];
  char (*args__local) [4];
  tuple *result;
  
  args._M_elems[1].super_handle.m_ptr = (handle)(PyObject *)0x2;
  local_40 = (pybind11 *)local_38;
  handle::handle(&local_50,(PyObject *)0x0);
  local_48 = (PyObject *)detail::type_caster<char,_void>::cast(*args_,automatic_reference,local_50);
  reinterpret_steal<pybind11::object>((pybind11 *)local_38,(handle)local_48);
  local_40 = (pybind11 *)&args;
  handle::handle((handle *)&__range2,(PyObject *)0x0);
  local_68 = (PyObject *)
             detail::type_caster<char,_void>::cast(*args__1,automatic_reference,(handle)__range2);
  reinterpret_steal<pybind11::object>((pybind11 *)&args,(handle)local_68);
  __begin0 = (iterator)local_38;
  __end0 = std::array<pybind11::object,_2UL>::begin((array<pybind11::object,_2UL> *)__begin0);
  arg_value = std::array<pybind11::object,_2UL>::end((array<pybind11::object,_2UL> *)__begin0);
  while( true ) {
    if (__end0 == arg_value) {
      __range2_1._6_1_ = 0;
      tuple::tuple((tuple *)this,2);
      __range2_1._0_4_ = 0;
      __begin0_1 = (iterator)local_38;
      __end0_1 = std::array<pybind11::object,_2UL>::begin
                           ((array<pybind11::object,_2UL> *)__begin0_1);
      arg_value_1 = std::array<pybind11::object,_2UL>::end
                              ((array<pybind11::object,_2UL> *)__begin0_1);
      while( true ) {
        if (__end0_1 == arg_value_1) {
          __range2_1._6_1_ = 1;
          std::array<pybind11::object,_2UL>::~array((array<pybind11::object,_2UL> *)local_38);
          return (object)(object)this;
        }
        local_118 = __end0_1;
        local_120 = object::release(__end0_1);
        ppPVar4 = handle::ptr(&local_120);
        pPVar1 = (PyTypeObject *)*ppPVar4;
        ppPVar4 = handle::ptr((handle *)this);
        iVar3 = PyType_HasFeature((*ppPVar4)->ob_type,0x4000000);
        if (iVar3 == 0) break;
        ppPVar4 = handle::ptr((handle *)this);
        (&(*ppPVar4)[1].ob_type)[(int)__range2_1] = pPVar1;
        __end0_1 = __end0_1 + 1;
        __range2_1._0_4_ = (int)__range2_1 + 1;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/cast.h"
                    ,0x496,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <const char (&)[4], const char (&)[4]>]"
                   );
    }
    local_90 = __end0;
    bVar2 = handle::operator_cast_to_bool(&__end0->super_handle);
    if (!bVar2) break;
    __end0 = __end0 + 1;
  }
  __range2_1._7_1_ = 1;
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  type_id<std::tuple<char_const(&)[4],char_const(&)[4]>>();
  std::operator+(local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          "make_tuple(): unable to convert arguments of types \'");
  std::operator+(local_b0,local_d0);
  cast_error::runtime_error(this_00,local_b0);
  __range2_1._7_1_ = 0;
  __cxa_throw(this_00,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    const size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (auto &arg_value : args) {
        if (!arg_value) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            throw cast_error("make_tuple(): unable to convert arguments of types '" +
                (std::string) type_id<std::tuple<Args...>>() + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}